

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::write_content
                  (Stream *strm,ContentProviderWithCloser *content_provider,size_t offset,
                  size_t length)

{
  ulong __args;
  unsigned_long __args_1;
  ssize_t written_length;
  ssize_t local_b0;
  ulong local_a8;
  size_t local_a0;
  Stream *local_98;
  ContentProviderWithCloser *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  anon_class_24_3_758dca88 local_68;
  function<void_(const_char_*,_unsigned_long)> local_50;
  
  local_a8 = offset;
  local_a0 = offset;
  local_98 = strm;
  local_90 = content_provider;
  do {
    __args = local_a8;
    __args_1 = (length + offset) - local_a8;
    if (length + offset < local_a8 || __args_1 == 0) {
      return local_a8 - local_a0;
    }
    local_b0 = 0;
    local_68.offset = &local_a8;
    local_68.strm = local_98;
    local_68.written_length = &local_b0;
    std::function<void(char_const*,unsigned_long)>::
    function<httplib::detail::write_content(httplib::Stream&,std::function<void(unsigned_long,unsigned_long,std::function<void(char_const*,unsigned_long)>,std::function<void()>)>,unsigned_long,unsigned_long)::_lambda(char_const*,unsigned_long)_1_,void>
              ((function<void(char_const*,unsigned_long)> *)&local_50,&local_68);
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1738:9)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1738:9)>
               ::_M_manager;
    local_88._M_unused._M_object = &local_b0;
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::operator()(local_90,__args,__args_1,&local_50,(function<void_()> *)&local_88);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
  } while (-1 < local_b0);
  return local_b0;
}

Assistant:

inline ssize_t write_content(Stream &strm,
                             ContentProviderWithCloser content_provider,
                             size_t offset, size_t length) {
  size_t begin_offset = offset;
  size_t end_offset = offset + length;
  while (offset < end_offset) {
    ssize_t written_length = 0;
    content_provider(
        offset, end_offset - offset,
        [&](const char *d, size_t l) {
          offset += l;
          written_length = strm.write(d, l);
        },
        [&](void) { written_length = -1; });
    if (written_length < 0) { return written_length; }
  }
  return static_cast<ssize_t>(offset - begin_offset);
}